

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

bool __thiscall testing::internal::DeathTestImpl::Passed(DeathTestImpl *this,bool status_ok)

{
  uint uVar1;
  bool bVar2;
  Message *pMVar3;
  uint uVar4;
  bool bVar5;
  Message buffer;
  string local_70;
  string local_50;
  string error_message;
  
  if (this->spawned_ != true) {
    return false;
  }
  GetCapturedStderr_abi_cxx11_();
  Message::Message(&buffer);
  std::operator<<((ostream *)((long)buffer.ss_.ptr_ + 0x10),"Death test: ");
  local_70._M_dataplus._M_p = this->statement_;
  pMVar3 = Message::operator<<(&buffer,(char **)&local_70);
  Message::operator<<(pMVar3,(char (*) [2])0x21b41f);
  switch(this->outcome_) {
  case DIED:
    if (status_ok) {
      bVar2 = RE::PartialMatch(error_message._M_dataplus._M_p,this->regex_);
      bVar5 = true;
      if (bVar2) goto LAB_001cf157;
      std::operator<<((ostream *)((long)buffer.ss_.ptr_ + 0x10),
                      "    Result: died but not with expected error.\n");
      std::operator<<((ostream *)((long)buffer.ss_.ptr_ + 0x10),"  Expected: ");
      local_50._M_dataplus._M_p = *(pointer *)this->regex_;
      pMVar3 = Message::operator<<(&buffer,(char **)&local_50);
      pMVar3 = Message::operator<<(pMVar3,(char (*) [2])0x21b41f);
      pMVar3 = Message::operator<<(pMVar3,(char (*) [13])"Actual msg:\n");
      FormatDeathTestOutput(&local_70,&error_message);
      Message::operator<<(pMVar3,&local_70);
    }
    else {
      std::operator<<((ostream *)((long)buffer.ss_.ptr_ + 0x10),
                      "    Result: died but not with expected exit code:\n");
      std::operator<<((ostream *)((long)buffer.ss_.ptr_ + 0x10),"            ");
      uVar1 = this->status_;
      Message::Message((Message *)&local_50);
      uVar4 = uVar1 & 0x7f;
      if (uVar4 == 0) {
        std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"Exited with exit status ");
        std::ostream::operator<<
                  ((stringstream *)(local_50._M_dataplus._M_p + 0x10),uVar1 >> 8 & 0xff);
      }
      else if (0x1ffffff < (int)(uVar4 * 0x1000000 + 0x1000000)) {
        std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),"Terminated by signal ");
        std::ostream::operator<<((stringstream *)(local_50._M_dataplus._M_p + 0x10),uVar4);
      }
      if ((char)uVar1 < '\0') {
        std::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10)," (core dumped)");
      }
      StringStreamToString(&local_70,(stringstream *)local_50._M_dataplus._M_p);
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_50);
      std::operator<<((ostream *)((long)buffer.ss_.ptr_ + 0x10),(string *)&local_70);
      std::operator<<((ostream *)((long)buffer.ss_.ptr_ + 0x10),"\n");
      std::operator<<((ostream *)((long)buffer.ss_.ptr_ + 0x10),"Actual msg:\n");
      FormatDeathTestOutput(&local_50,&error_message);
      std::operator<<((ostream *)((long)buffer.ss_.ptr_ + 0x10),(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    break;
  case LIVED:
    std::operator<<((ostream *)((long)buffer.ss_.ptr_ + 0x10),"    Result: failed to die.\n");
    std::operator<<((ostream *)((long)buffer.ss_.ptr_ + 0x10)," Error msg:\n");
    FormatDeathTestOutput(&local_70,&error_message);
    std::operator<<((ostream *)((long)buffer.ss_.ptr_ + 0x10),(string *)&local_70);
    break;
  case RETURNED:
    std::operator<<((ostream *)((long)buffer.ss_.ptr_ + 0x10),
                    "    Result: illegal return in test statement.\n");
    std::operator<<((ostream *)((long)buffer.ss_.ptr_ + 0x10)," Error msg:\n");
    FormatDeathTestOutput(&local_70,&error_message);
    std::operator<<((ostream *)((long)buffer.ss_.ptr_ + 0x10),(string *)&local_70);
    break;
  case THREW:
    std::operator<<((ostream *)((long)buffer.ss_.ptr_ + 0x10),"    Result: threw an exception.\n");
    std::operator<<((ostream *)((long)buffer.ss_.ptr_ + 0x10)," Error msg:\n");
    FormatDeathTestOutput(&local_70,&error_message);
    std::operator<<((ostream *)((long)buffer.ss_.ptr_ + 0x10),(string *)&local_70);
    break;
  default:
    GTestLog::GTestLog((GTestLog *)&local_70,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/build_O2/googletest-src/googletest/src/gtest-death-test.cc"
                       ,0x246);
    std::operator<<((ostream *)&std::cerr,
                    "DeathTest::Passed somehow called before conclusion of test");
    GTestLog::~GTestLog((GTestLog *)&local_70);
    goto LAB_001cf155;
  }
  std::__cxx11::string::~string((string *)&local_70);
LAB_001cf155:
  bVar5 = false;
LAB_001cf157:
  StringStreamToString(&local_70,(stringstream *)buffer.ss_.ptr_);
  DeathTest::set_last_death_test_message(&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&buffer.ss_);
  std::__cxx11::string::~string((string *)&error_message);
  return bVar5;
}

Assistant:

bool DeathTestImpl::Passed(bool status_ok) {
  if (!spawned())
    return false;

  const std::string error_message = GetCapturedStderr();

  bool success = false;
  Message buffer;

  buffer << "Death test: " << statement() << "\n";
  switch (outcome()) {
    case LIVED:
      buffer << "    Result: failed to die.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case THREW:
      buffer << "    Result: threw an exception.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case RETURNED:
      buffer << "    Result: illegal return in test statement.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case DIED:
      if (status_ok) {
        const bool matched = RE::PartialMatch(error_message.c_str(), *regex());
        if (matched) {
          success = true;
        } else {
          buffer << "    Result: died but not with expected error.\n"
                 << "  Expected: " << regex()->pattern() << "\n"
                 << "Actual msg:\n" << FormatDeathTestOutput(error_message);
        }
      } else {
        buffer << "    Result: died but not with expected exit code:\n"
               << "            " << ExitSummary(status()) << "\n"
               << "Actual msg:\n" << FormatDeathTestOutput(error_message);
      }
      break;
    case IN_PROGRESS:
    default:
      GTEST_LOG_(FATAL)
          << "DeathTest::Passed somehow called before conclusion of test";
  }

  DeathTest::set_last_death_test_message(buffer.GetString());
  return success;
}